

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void init_httprequest(httprequest *req)

{
  httprequest *req_local;
  
  req->checkindex = 0;
  req->offset = 0;
  req->testno = -4;
  req->partno = 0;
  req->connect_request = false;
  req->open = true;
  req->auth_req = false;
  req->auth = false;
  req->cl = 0;
  req->digest = false;
  req->ntlm = false;
  req->skip = 0;
  req->writedelay = 0;
  req->rcmd = 0;
  req->prot_version = 0;
  req->callcount = 0;
  req->connect_port = 0;
  req->done_processing = 0;
  req->upgrade = false;
  req->upgrade_request = false;
  return;
}

Assistant:

static void init_httprequest(struct httprequest *req)
{
  req->checkindex = 0;
  req->offset = 0;
  req->testno = DOCNUMBER_NOTHING;
  req->partno = 0;
  req->connect_request = FALSE;
  req->open = TRUE;
  req->auth_req = FALSE;
  req->auth = FALSE;
  req->cl = 0;
  req->digest = FALSE;
  req->ntlm = FALSE;
  req->skip = 0;
  req->writedelay = 0;
  req->rcmd = RCMD_NORMALREQ;
  req->prot_version = 0;
  req->callcount = 0;
  req->connect_port = 0;
  req->done_processing = 0;
  req->upgrade = 0;
  req->upgrade_request = 0;
}